

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

void __thiscall Js::JavascriptLibrary::BindReference(JavascriptLibrary *this,void *addr)

{
  Type *this_00;
  code *pcVar1;
  bool bVar2;
  Recycler *this_01;
  WriteBarrierPtr<void> *pWVar3;
  undefined4 *puVar4;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  this_00 = &this->bindRefChunkCurrent;
  if ((this->bindRefChunkCurrent).ptr == (this->bindRefChunkEnd).ptr) {
    local_58 = (undefined1  [8])&Memory::WriteBarrierPtr<void>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 2;
    data.count = (size_t)anon_var_dwarf_74a5554;
    data.filename._0_4_ = 0x1caa;
    this_01 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_58);
    pWVar3 = Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<void>,false>
                       ((Memory *)this_01,(Recycler *)Memory::Recycler::AllocZero,0,2);
    Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::WriteBarrierSet
              (&this->bindRefChunkEnd,pWVar3 + 1);
    if ((this->bindRefChunkBegin).ptr == (void *)0x0) {
      Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::WriteBarrierSet(this_00,pWVar3);
      Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->bindRefChunkBegin,this_00->ptr);
    }
    else {
      Memory::WriteBarrierPtr<void>::WriteBarrierSet(this_00->ptr,pWVar3);
      Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::WriteBarrierSet(this_00,pWVar3);
    }
  }
  pWVar3 = this_00->ptr;
  if ((this->bindRefChunkEnd).ptr < pWVar3 + 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1cb8,"((bindRefChunkCurrent+1) <= bindRefChunkEnd)",
                                "(bindRefChunkCurrent+1) <= bindRefChunkEnd");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    pWVar3 = this_00->ptr;
  }
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(pWVar3,addr);
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::operator++
            ((WriteBarrierPtr<Memory::WriteBarrierPtr<void>_> *)local_58,(int)this_00);
  return;
}

Assistant:

void JavascriptLibrary::BindReference(void * addr)
    {
        // The last void* is the linklist connecting to next block.
        if (bindRefChunkCurrent == bindRefChunkEnd)
        {
            Field(void*)* tmpBindRefChunk = RecyclerNewArrayZ(recycler,
                Field(void*), HeapConstants::ObjectGranularity / sizeof(void *));
            // reserve the last void* as the linklist node.
            bindRefChunkEnd = tmpBindRefChunk + (HeapConstants::ObjectGranularity / sizeof(void *) -1 );
            if (bindRefChunkBegin == nullptr)
            {
                bindRefChunkCurrent = tmpBindRefChunk;
                bindRefChunkBegin = bindRefChunkCurrent;
            }
            else
            {
                *bindRefChunkCurrent = tmpBindRefChunk;
                bindRefChunkCurrent = tmpBindRefChunk;
            }
        }
        Assert((bindRefChunkCurrent+1) <= bindRefChunkEnd);
        *bindRefChunkCurrent = addr;
        bindRefChunkCurrent++;
    }